

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeletonAnimationTrack
          (OgreBinarySerializer *this,Skeleton *param_1,Animation *dest)

{
  uint16_t uVar1;
  Bone *pBVar2;
  DeadlyImportError *this_00;
  ulong uVar3;
  string local_1c0;
  VertexAnimationTrack track;
  
  uVar1 = Read<unsigned_short>(this);
  pBVar2 = Skeleton::BoneById(dest->parentSkeleton,uVar1);
  if (pBVar2 != (Bone *)0x0) {
    VertexAnimationTrack::VertexAnimationTrack(&track);
    track.type = VAT_TRANSFORM;
    std::__cxx11::string::_M_assign((string *)&track.boneName);
    uVar1 = ReadHeader(this,true);
    while( true ) {
      uVar3 = (long)this->m_reader->end - (long)this->m_reader->current;
      if ((uVar1 != 0x4110) || ((uVar3 & 0xffffffff) == 0)) break;
      ReadSkeletonAnimationKeyFrame(this,&track);
      uVar1 = 0x4110;
      if (*(int *)&this->m_reader->end != *(int *)&this->m_reader->current) {
        uVar1 = ReadHeader(this,true);
      }
    }
    if ((int)uVar3 != 0) {
      RollbackHeader(this);
    }
    std::
    vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
    ::push_back(&dest->tracks,&track);
    VertexAnimationTrack::~VertexAnimationTrack(&track);
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&track);
  std::operator<<((ostream *)&track,"Cannot read animation track, target bone ");
  std::ostream::operator<<(&track,uVar1);
  std::operator<<((ostream *)&track," not in target Skeleton");
  std::__cxx11::stringbuf::str();
  DeadlyImportError::DeadlyImportError(this_00,&local_1c0);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreBinarySerializer::ReadSkeletonAnimationTrack(Skeleton * /*skeleton*/, Animation *dest)
{
    uint16_t boneId = Read<uint16_t>();
    Bone *bone = dest->parentSkeleton->BoneById(boneId);
    if (!bone) {
        throw DeadlyImportError(Formatter::format() << "Cannot read animation track, target bone " << boneId << " not in target Skeleton");
    }

    VertexAnimationTrack track;
    track.type = VertexAnimationTrack::VAT_TRANSFORM;
    track.boneName = bone->name;

    uint16_t id = ReadHeader();
    while (!AtEnd() && id == SKELETON_ANIMATION_TRACK_KEYFRAME)
    {
        ReadSkeletonAnimationKeyFrame(&track);

        if (!AtEnd())
            id = ReadHeader();
    }
    if (!AtEnd())
        RollbackHeader();

    dest->tracks.push_back(track);
}